

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 crnd::dxt1_block::get_block_colors4(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  dxt1_block in_RAX;
  color_quad_u8 c1;
  color_quad_u8 c0;
  
  _c1 = in_RAX;
  unpack_color((dxt1_block *)&c0,color0,true,0xff);
  unpack_color((dxt1_block *)&c1,color1,true,0xff);
  (pDst->field_0).field_0 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391d7b_for_color_quad<unsigned_char,_int>_3_0)
       c0;
  pDst[1].field_0.field_0 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391d7b_for_color_quad<unsigned_char,_int>_3_0)
       c1.field_0;
  color_quad<unsigned_char,_int>::set
            (pDst + 2,(((uint)c1.field_0 & 0xff) + ((uint)c0.field_0 & 0xff) * 2) / 3,
             (((uint)c1.field_0 >> 8 & 0xff) + ((uint)c0.field_0 >> 8 & 0xff) * 2) / 3,
             (((uint)c1.field_0 >> 0x10 & 0xff) + ((uint)c0.field_0 >> 0xf & 0x1fe)) / 3,0xff);
  color_quad<unsigned_char,_int>::set
            (pDst + 3,((uint)c0.field_0.field_0.r + (uint)c1.field_0.field_0.r * 2) / 3,
             ((uint)c0.field_0.field_0.g + (uint)c1.field_0.field_0.g * 2) / 3,
             ((uint)c0.field_0.field_0.b + (uint)c1.field_0.field_0.b * 2) / 3,0xff);
  return 4;
}

Assistant:

uint32 dxt1_block::get_block_colors4(color_quad_u8* pDst, uint16 color0, uint16 color1)
    {
        color_quad_u8 c0(unpack_color(color0, true));
        color_quad_u8 c1(unpack_color(color1, true));

        pDst[0] = c0;
        pDst[1] = c1;

        // 12/14/09 - Supposed to round according to DX docs, but this conflicts with the OpenGL S3TC spec. ?
        // Turns out some GPU's round and some don't. Great.
        //pDst[2].set( (c0.r * 2 + c1.r + 1) / 3, (c0.g * 2 + c1.g + 1) / 3, (c0.b * 2 + c1.b + 1) / 3, 255U);
        //pDst[3].set( (c1.r * 2 + c0.r + 1) / 3, (c1.g * 2 + c0.g + 1) / 3, (c1.b * 2 + c0.b + 1) / 3, 255U);

        pDst[2].set((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3, 255U);
        pDst[3].set((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3, 255U);

        return 4;
    }